

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printEndpointReference
          (PrinterStream *this,EndpointReference *e)

{
  ProcessorInstance *pPVar1;
  CodePrinter *pCVar2;
  
  if ((e->processor).object != (ProcessorInstance *)0x0) {
    pCVar2 = this->out;
    pPVar1 = pool_ptr<soul::heart::ProcessorInstance>::operator->(&e->processor);
    pCVar2 = choc::text::CodePrinter::operator<<(pCVar2,&pPVar1->instanceName);
    choc::text::CodePrinter::operator<<(pCVar2,".");
  }
  choc::text::CodePrinter::operator<<(this->out,&e->endpointName);
  if ((e->endpointIndex).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    pCVar2 = choc::text::CodePrinter::operator<<(this->out,"[");
    pCVar2 = choc::text::CodePrinter::operator<<
                       (pCVar2,(e->endpointIndex).super__Optional_base<unsigned_long,_true,_true>.
                               _M_payload.super__Optional_payload_base<unsigned_long>._M_payload.
                               _M_value);
    choc::text::CodePrinter::operator<<(pCVar2,"]");
    return;
  }
  return;
}

Assistant:

void printEndpointReference (const heart::EndpointReference& e)
        {
            if (e.processor != nullptr)
                out << e.processor->instanceName << ".";

            out << e.endpointName;

            if (e.endpointIndex)
                out << "[" << *e.endpointIndex << "]";
        }